

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integral_image.cpp
# Opt level: O3

void compute_integral_img(float *gray_image,integral_image *iimage)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  float *pfVar4;
  long lVar5;
  ulong uVar6;
  float *pfVar7;
  long lVar8;
  float *pfVar9;
  ulong uVar10;
  float fVar11;
  
  pfVar4 = iimage->data;
  iVar1 = iimage->data_width;
  uVar2 = iimage->width;
  lVar5 = (long)(int)uVar2;
  uVar3 = iimage->height;
  if (0 < lVar5) {
    fVar11 = 0.0;
    lVar8 = 0;
    do {
      fVar11 = fVar11 + gray_image[lVar8];
      pfVar4[lVar8] = fVar11;
      lVar8 = lVar8 + 1;
    } while (lVar5 != lVar8);
  }
  if (1 < (int)uVar3) {
    pfVar7 = gray_image + lVar5;
    uVar10 = 1;
    pfVar9 = pfVar4;
    do {
      pfVar9 = pfVar9 + iVar1;
      if (0 < (int)uVar2) {
        fVar11 = 0.0;
        uVar6 = 0;
        do {
          fVar11 = fVar11 + pfVar7[uVar6];
          pfVar9[uVar6] = fVar11 + pfVar4[uVar6];
          uVar6 = uVar6 + 1;
        } while (uVar2 != uVar6);
      }
      uVar10 = uVar10 + 1;
      pfVar4 = pfVar4 + iVar1;
      pfVar7 = pfVar7 + lVar5;
    } while (uVar10 != uVar3);
  }
  return;
}

Assistant:

void compute_integral_img(float *gray_image, struct integral_image *iimage) {
    
    float *iimage_data = iimage->data;
    int data_width = iimage->data_width;
    int width = iimage->width;
    int height = iimage->height;

    float row_sum = 0.0f;

    /* sum up the first row */
    for (int i = 0; i < width; ++i) {
        /* previous rows are 0 */
        row_sum += gray_image[i];
        iimage_data[i] = row_sum;
    }

    /* sum all remaining rows*/
    for (int j = 1; j < height; ++j) {
        row_sum = 0.0f;
        for (int i = 0; i < width; ++i) {
            row_sum += gray_image[j * width + i];
            /*add sum of current row until current idx to sum of all previous rows until current index */
            iimage_data[j * data_width + i] = row_sum + iimage_data[(j - 1) * data_width + i];
        }
    }
}